

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigmund~.c
# Opt level: O1

void sigmund_getpitch(int npeak,t_peak_conflict *peakv,t_float *freqp,t_float npts,t_float srate,
                     t_float nharmonics,t_float amppower,int loud)

{
  float fVar1;
  bool bVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  t_peak_conflict *ptVar7;
  ulong uVar8;
  t_peak_conflict *ptVar9;
  ulong uVar10;
  uint uVar11;
  void *__s;
  float fVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  float fVar16;
  float fVar17;
  int iVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  t_peak_conflict *bigpeaks [12];
  
  uVar4 = (uint)npts;
  uVar11 = 0xffffffd0;
  if (uVar4 != 0) {
    do {
      uVar11 = uVar11 + 0x30;
      bVar2 = 1 < uVar4;
      uVar4 = (int)uVar4 >> 1;
    } while (bVar2);
  }
  uVar5 = (long)(int)uVar11 << 2;
  if (0xffff < uVar5) {
    uVar5 = 0x10000;
  }
  lVar3 = -(ulong)((int)uVar5 + 0xfU & 0x3fff0);
  __s = (void *)((long)bigpeaks + lVar3 + -8);
  if (npeak < 1) {
    fVar12 = 0.0;
  }
  else {
    fVar17 = (srate * 0.5) / npts;
    if (0 < (int)uVar11) {
      *(undefined8 *)((long)&uStack_f0 + lVar3) = 0x1ad43e;
      memset(__s,0,(ulong)uVar11 * 4);
    }
    uVar5 = 1;
    if (1 < npeak) {
      uVar5 = (ulong)(uint)npeak;
    }
    lVar6 = 0;
    do {
      *(undefined4 *)((long)&peakv->p_tmp + lVar6) = 0;
      *(float *)((long)&peakv->p_salience + lVar6) =
           *(float *)((long)&peakv->p_pit + lVar6) * -0.0 + *(float *)((long)&peakv->p_db + lVar6);
      lVar6 = lVar6 + 0x20;
    } while (uVar5 * 0x20 != lVar6);
    uVar5 = 1;
    if (1 < npeak) {
      uVar5 = (ulong)(uint)npeak;
    }
    uVar10 = 0;
    do {
      ptVar7 = (t_peak_conflict *)0x0;
      uVar8 = uVar5;
      ptVar9 = peakv;
      fVar12 = -1e+20;
      do {
        if (((ptVar9->p_tmp == 0.0) && (!NAN(ptVar9->p_tmp))) && (fVar12 < ptVar9->p_salience)) {
          ptVar7 = ptVar9;
          fVar12 = ptVar9->p_salience;
        }
        ptVar9 = ptVar9 + 1;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
      if (ptVar7 == (t_peak_conflict *)0x0) goto LAB_001ad516;
      bigpeaks[uVar10 - 1] = ptVar7;
      ptVar7->p_tmp = 1.0;
      uVar10 = uVar10 + 1;
    } while (uVar10 != 0xc);
    uVar10 = 0xc;
LAB_001ad516:
    if ((int)uVar10 == 0) {
      dVar13 = 0.0;
    }
    else {
      bigpeaks[0xb] = (t_peak_conflict *)((double)fVar17 + (double)fVar17);
      fVar12 = 0.0;
      uVar5 = 0;
      do {
        ptVar7 = bigpeaks[uVar5 - 1];
        dVar13 = (double)ptVar7->p_freq / (double)bigpeaks[0xb];
        *(undefined8 *)((long)&uStack_f0 + lVar3) = 0x1ad571;
        dVar13 = log(dVar13);
        fVar16 = ptVar7->p_amp;
        *(undefined8 *)((long)&uStack_f0 + lVar3) = 0x1ad595;
        dVar14 = pow((double)fVar16,(double)amppower);
        iVar18 = 0;
        do {
          if (iVar18 == 0x10) break;
          *(undefined8 *)((long)&uStack_f0 + lVar3) = 0x1ad5d4;
          dVar15 = log((double)(iVar18 + 1));
          uVar4 = (uint)((float)(dVar15 * -69.24936196267028 +
                                (double)(float)(dVar13 * 69.24936196267028)) + -0.5);
          if ((int)(uVar4 + 2) < (int)uVar11 && -3 < (int)uVar4) {
            uVar8 = 0;
            if (0 < (int)uVar4) {
              uVar8 = (ulong)uVar4;
            }
            lVar6 = uVar8 - 1;
            do {
              *(float *)((long)bigpeaks + lVar6 * 4 + lVar3 + -4) =
                   *(float *)((long)bigpeaks + lVar6 * 4 + lVar3 + -4) +
                   ((float)dVar14 * nharmonics) / ((float)iVar18 + nharmonics);
              lVar6 = lVar6 + 1;
            } while (lVar6 < (int)(uVar4 + 2));
          }
          iVar18 = iVar18 + 1;
        } while (-3 < (int)uVar4);
        fVar12 = fVar12 + (float)dVar14;
        uVar5 = uVar5 + 1;
      } while (uVar5 != (uVar10 & 0xffffffff));
      dVar13 = (double)fVar12 * 0.4;
    }
    if ((int)uVar11 < 1) {
      dVar14 = -1.0000000200408773e+20;
      fVar12 = -1.0;
    }
    else {
      fVar12 = -1.0;
      uVar5 = 0;
      fVar16 = -1e+20;
      do {
        fVar1 = *(float *)((long)__s + uVar5 * 4);
        fVar21 = fVar1;
        if (fVar1 <= fVar16) {
          fVar21 = fVar16;
        }
        fVar12 = (float)(~-(uint)(fVar16 < fVar1) & (uint)fVar12 |
                        (uint)(float)(int)uVar5 & -(uint)(fVar16 < fVar1));
        uVar5 = uVar5 + 1;
        fVar16 = fVar21;
      } while (uVar11 != uVar5);
      dVar14 = (double)fVar21;
    }
    fVar16 = -1.0;
    if (dVar13 <= dVar14) {
      fVar16 = fVar12;
    }
    fVar12 = 0.0;
    if (0.0 <= fVar16) {
      if ((0.0 < fVar16) && (fVar16 < (float)(int)(uVar11 - 1))) {
        lVar6 = (long)(int)fVar16;
        fVar12 = *(float *)((long)&uStack_f0 + lVar6 * 4 + lVar3 + 4);
        fVar1 = *(float *)((long)bigpeaks + lVar6 * 4 + lVar3 + -4);
        fVar16 = fVar16 + (fVar1 - fVar12) / (fVar1 + *(float *)((long)__s + lVar6 * 4) + fVar12);
      }
      *(undefined8 *)((long)&uStack_f0 + lVar3) = 0x1ad773;
      dVar13 = exp((double)fVar16 * 0.01444056626166552);
      fVar12 = (float)(dVar13 * (double)(fVar17 + fVar17));
      fVar17 = 0.0;
      fVar16 = 0.0;
      if ((int)uVar10 != 0) {
        uVar5 = 0;
        do {
          fVar1 = bigpeaks[uVar5 - 1]->p_freq;
          fVar20 = fVar1 / fVar12;
          fVar21 = fVar20 + 0.5;
          if ((int)fVar21 - 1U < 0x10) {
            iVar18 = (int)fVar21;
            fVar19 = (float)iVar18;
            fVar20 = fVar20 - fVar19;
            fVar21 = (float)iVar18 * 0.015;
            if ((fVar20 < fVar21) && (-fVar21 < fVar20)) {
              fVar21 = bigpeaks[uVar5 - 1]->p_amp * fVar19;
              fVar17 = fVar17 + fVar21;
              fVar16 = fVar16 + (fVar1 * fVar21) / fVar19;
            }
          }
          uVar5 = uVar5 + 1;
        } while ((uVar10 & 0xffffffff) != uVar5);
      }
      if (0.0 < fVar17) {
        fVar12 = fVar16 / fVar17;
      }
    }
  }
  *freqp = (t_float)(-(uint)(!NAN(fVar12) && !NAN(fVar12)) & (uint)fVar12);
  return;
}

Assistant:

static void sigmund_getpitch(int npeak, t_peak *peakv, t_float *freqp,
    t_float npts, t_float srate, t_float nharmonics, t_float amppower, int loud)
{
    t_float fperbin = 0.5 * srate / npts;
    int npit = 48 * sigmund_ilog2(npts), i, j, k, nsalient;
    t_float bestbin, bestweight, sumamp, sumweight, sumfreq, freq;
    t_float *weights =  0;
    t_peak *bigpeaks[PITCHNPEAK];
    size_t weight_len = sizeof(t_float) * npit;
    if(weight_len > 65536)
      weight_len = 65536;
    weights = (t_float *)alloca(weight_len);
    if (npeak < 1)
    {
        freq = 0;
        goto done;
    }
    for (i = 0; i < npit; i++)
        weights[i] = 0;
    for (i = 0; i < npeak; i++)
    {
        peakv[i].p_tmp = 0;
        peakv[i].p_salience = peakv[i].p_db - DBPERHALFTONE * peakv[i].p_pit;
    }
    for (nsalient = 0; nsalient < PITCHNPEAK; nsalient++)
    {
        t_peak *bestpeak = 0;
        t_float bestsalience = -1e20;
        for (j = 0; j < npeak; j++)
            if (peakv[j].p_tmp == 0 && peakv[j].p_salience > bestsalience)
        {
            bestsalience = peakv[j].p_salience;
            bestpeak = &peakv[j];
        }
        if (!bestpeak)
            break;
        bigpeaks[nsalient] = bestpeak;
        bestpeak->p_tmp = 1;
        /* post("peak f=%f a=%f", bestpeak->p_freq, bestpeak->p_amp); */
    }
    sumweight = 0;
    for (i = 0; i < nsalient; i++)
    {
        t_peak *thispeak = bigpeaks[i];
        t_float weightindex = (48./LOG2) *
            log(thispeak->p_freq/(2.*fperbin));
        t_float loudness = pow(thispeak->p_amp, amppower);
        /* post("index %f, uncertainty %f", weightindex, pitchuncertainty); */
        for (j = 0; j < SUBHARMONICS; j++)
        {
            t_float subindex = weightindex -
                (48./LOG2) * log(j + 1.);
            int loindex = subindex - 0.5;
            int hiindex = loindex+2;
            if (hiindex < 0)
                break;
            if (hiindex >= npit)
                continue;
            if (loindex < 0)
                loindex = 0;
            for (k = loindex; k <= hiindex; k++)
                weights[k] += loudness * nharmonics / (nharmonics + j);
        }
        sumweight += loudness;
    }
    bestbin = -1;
    bestweight = -1e20;
    for (i = 0; i < npit; i++)
        if (weights[i] > bestweight)
            bestweight = weights[i], bestbin = i;
    if (bestweight < sumweight * 0.4)
        bestbin = -1;
    
    if (bestbin < 0)
    {
        freq = 0;
        goto done;
    }
    if (bestbin > 0 && bestbin < npit-1)
    {
        int ibest = bestbin;
        bestbin += (weights[ibest+1] - weights[ibest-1]) /
            (weights[ibest+1] +  weights[ibest] + weights[ibest-1]);
    }
    freq = 2*fperbin * exp((LOG2/48.)*bestbin);
    for (sumamp = sumweight = sumfreq = 0, i = 0; i < nsalient; i++)
    {
        t_peak *thispeak = bigpeaks[i];
        t_float thisloudness = thispeak->p_amp;
        t_float thisfreq = thispeak->p_freq;
        t_float harmonic = thisfreq/freq;
        t_float intpart = (int)(0.5 + harmonic);
        t_float inharm = harmonic - intpart;
#if 0
        if (loud)
            post("freq %f intpart %f inharm %f", freq, intpart, inharm);
#endif
        if (intpart >= 1 && intpart <= 16 &&
            inharm < 0.015 * intpart && inharm > - (0.015 * intpart))
        {
            t_float weight = thisloudness * intpart;
            sumweight += weight;
            sumfreq += weight*thisfreq/intpart;
#if 0
            if (loud)
                post("weight %f freq %f", weight, thisfreq);
#endif
        }
    }
    if (sumweight > 0)
        freq = sumfreq / sumweight;
done:
    if (!(freq >= 0 || freq <= 0))
    {
        /* post("freq nan cancelled"); */
        freq = 0;
    }
    *freqp = freq;
}